

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultPhoto.h
# Opt level: O0

void __thiscall TgBot::InlineQueryResultPhoto::InlineQueryResultPhoto(InlineQueryResultPhoto *this)

{
  InlineQueryResultPhoto *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultPhoto_0051b420;
  std::__cxx11::string::string((string *)&this->photoUrl);
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->photoWidth = 0;
  this->photoHeight = 0;
  return;
}

Assistant:

InlineQueryResultPhoto() {
        this->type = TYPE;
        this->photoWidth = 0;
        this->photoHeight = 0;
    }